

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrLib.c
# Opt level: O1

void Rwr_ManIncTravId(Rwr_Man_t *p)

{
  uint uVar1;
  void **ppvVar2;
  long lVar3;
  long lVar4;
  
  uVar1 = p->nTravIds;
  p->nTravIds = uVar1 + 1;
  if (0x8ffffffe < uVar1) {
    lVar3 = (long)p->vForest->nSize;
    if (0 < lVar3) {
      ppvVar2 = p->vForest->pArray;
      lVar4 = 0;
      do {
        *(undefined4 *)((long)ppvVar2[lVar4] + 4) = 0;
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
    p->nTravIds = 1;
  }
  return;
}

Assistant:

void Rwr_ManIncTravId( Rwr_Man_t * p )
{
    Rwr_Node_t * pNode;
    int i;
    if ( p->nTravIds++ < 0x8FFFFFFF )
        return;
    Vec_PtrForEachEntry( Rwr_Node_t *, p->vForest, pNode, i )
        pNode->TravId = 0;
    p->nTravIds = 1;
}